

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

void Tas_ManWatchClause(Tas_Man_t *p,Tas_Cls_t *pClause,int Lit)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  
  if (Lit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if ((int)((uint)Lit >> 1) < p->pAig->nObjs) {
    if (pClause->nLits < 2) {
      __assert_fail("pClause->nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x3bd,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
    }
    if (pClause[1].iNext[0] == Lit) {
      piVar1 = p->pWatches;
      uVar3 = (ulong)(Lit ^ 1);
      iVar2 = piVar1[uVar3];
      pClause->iNext[0] = iVar2;
    }
    else {
      if (pClause[1].iNext[1] != Lit) {
        __assert_fail("pClause->pLits[0] == Lit || pClause->pLits[1] == Lit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x3be,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
      }
      piVar1 = p->pWatches;
      uVar3 = (ulong)(Lit ^ 1);
      iVar2 = piVar1[uVar3];
      pClause->iNext[1] = iVar2;
    }
    if (iVar2 == 0) {
      Vec_IntPush(p->vWatchLits,(int)uVar3);
      piVar1 = p->pWatches;
    }
    piVar1[uVar3] = (int)((ulong)((long)pClause - (long)(p->pStore).pData) >> 2);
    return;
  }
  __assert_fail("Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                ,0x3bc,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
}

Assistant:

static inline void Tas_ManWatchClause( Tas_Man_t * p, Tas_Cls_t * pClause, int Lit )
{
    assert( Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig) );
    assert( pClause->nLits >= 2 );
    assert( pClause->pLits[0] == Lit || pClause->pLits[1] == Lit );
    if ( pClause->pLits[0] == Lit )
        pClause->iNext[0] = p->pWatches[Abc_LitNot(Lit)];  
    else
        pClause->iNext[1] = p->pWatches[Abc_LitNot(Lit)];  
    if ( p->pWatches[Abc_LitNot(Lit)] == 0 )
        Vec_IntPush( p->vWatchLits, Abc_LitNot(Lit) );
    p->pWatches[Abc_LitNot(Lit)] = Tas_ClsHandle( p, pClause );
}